

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

void Sbd_ManCutReload(Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,int LevStop,Vec_Int_t *vCut,
                     Vec_Int_t *vCutTop,Vec_Int_t *vCutBot)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int Entry;
  int i;
  Vec_Int_t *vCutBot_local;
  Vec_Int_t *vCutTop_local;
  Vec_Int_t *vCut_local;
  int LevStop_local;
  Vec_Int_t *vLutLevs_local;
  Vec_Int_t *vMirrors_local;
  
  Vec_IntClear(vCutTop);
  Vec_IntClear(vCutBot);
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCut);
    if (iVar1 <= local_3c) {
      Vec_IntIsOrdered(vCut);
      return;
    }
    iVar1 = Vec_IntEntry(vCut,local_3c);
    if (iVar1 == 0) {
      __assert_fail("Entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                    ,0xe0,
                    "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar2 = Vec_IntEntry(vMirrors,iVar1);
    if (iVar2 != -1) {
      __assert_fail("Vec_IntEntry(vMirrors, Entry) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                    ,0xe1,
                    "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar2 = Vec_IntEntry(vLutLevs,iVar1);
    if (LevStop < iVar2) break;
    iVar2 = Vec_IntEntry(vLutLevs,iVar1);
    if (iVar2 == LevStop) {
      Vec_IntPush(vCutTop,iVar1);
    }
    else {
      Vec_IntPush(vCutBot,iVar1);
    }
    local_3c = local_3c + 1;
  }
  __assert_fail("Vec_IntEntry(vLutLevs, Entry) <= LevStop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                ,0xe2,
                "void Sbd_ManCutReload(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Sbd_ManCutReload( Vec_Int_t * vMirrors, Vec_Int_t * vLutLevs, int LevStop, Vec_Int_t * vCut, Vec_Int_t * vCutTop, Vec_Int_t * vCutBot )
{
    int i, Entry;
    Vec_IntClear( vCutTop );
    Vec_IntClear( vCutBot );
    Vec_IntForEachEntry( vCut, Entry, i )
    {
        assert( Entry );
        assert( Vec_IntEntry(vMirrors, Entry) == -1 );
        assert( Vec_IntEntry(vLutLevs, Entry) <= LevStop );
        if ( Vec_IntEntry(vLutLevs, Entry) == LevStop )
            Vec_IntPush( vCutTop, Entry );
        else
            Vec_IntPush( vCutBot, Entry );
    }
    Vec_IntIsOrdered( vCut );
}